

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t
ctrl_set_svc_ref_frame_config(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  AV1_COMP *pAVar2;
  long lVar3;
  long *local_48;
  uint i_1;
  uint i;
  aom_svc_ref_frame_config_t *data;
  AV1_COMP *cpi;
  __va_list_tag *args_local;
  aom_codec_alg_priv_t_conflict *ctx_local;
  
  pAVar2 = ctx->ppi->cpi;
  uVar1 = args->gp_offset;
  if (uVar1 < 0x29) {
    local_48 = (long *)((long)(int)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    local_48 = (long *)args->overflow_arg_area;
    args->overflow_arg_area = local_48 + 1;
  }
  lVar3 = *local_48;
  (pAVar2->ppi->rtc_ref).set_ref_frame_config = 1;
  i = 0;
  while( true ) {
    if (6 < i) {
      i_1 = 0;
      while( true ) {
        if (7 < i_1) {
          (pAVar2->svc).use_flexible_mode = 1;
          (pAVar2->svc).ksvc_fixed_mode = 0;
          return AOM_CODEC_OK;
        }
        if ((*(int *)(lVar3 + 0x38 + (ulong)i_1 * 4) != 0) &&
           (*(int *)(lVar3 + 0x38 + (ulong)i_1 * 4) != 1)) break;
        (pAVar2->ppi->rtc_ref).refresh[i_1] = *(int *)(lVar3 + 0x38 + (ulong)i_1 * 4);
        i_1 = i_1 + 1;
      }
      return AOM_CODEC_INVALID_PARAM;
    }
    if ((*(int *)(lVar3 + (ulong)i * 4) != 0) && (*(int *)(lVar3 + (ulong)i * 4) != 1)) break;
    if ((7 < *(int *)(lVar3 + 0x1c + (ulong)i * 4)) || (*(int *)(lVar3 + 0x1c + (ulong)i * 4) < 0))
    {
      return AOM_CODEC_INVALID_PARAM;
    }
    (pAVar2->ppi->rtc_ref).reference[i] = *(int *)(lVar3 + (ulong)i * 4);
    (pAVar2->ppi->rtc_ref).ref_idx[i] = *(int *)(lVar3 + 0x1c + (ulong)i * 4);
    i = i + 1;
  }
  return AOM_CODEC_INVALID_PARAM;
}

Assistant:

static aom_codec_err_t ctrl_set_svc_ref_frame_config(aom_codec_alg_priv_t *ctx,
                                                     va_list args) {
  AV1_COMP *const cpi = ctx->ppi->cpi;
  aom_svc_ref_frame_config_t *const data =
      va_arg(args, aom_svc_ref_frame_config_t *);
  cpi->ppi->rtc_ref.set_ref_frame_config = 1;
  for (unsigned int i = 0; i < INTER_REFS_PER_FRAME; ++i) {
    if (data->reference[i] != 0 && data->reference[i] != 1)
      return AOM_CODEC_INVALID_PARAM;
    if (data->ref_idx[i] > 7 || data->ref_idx[i] < 0)
      return AOM_CODEC_INVALID_PARAM;
    cpi->ppi->rtc_ref.reference[i] = data->reference[i];
    cpi->ppi->rtc_ref.ref_idx[i] = data->ref_idx[i];
  }
  for (unsigned int i = 0; i < REF_FRAMES; ++i) {
    if (data->refresh[i] != 0 && data->refresh[i] != 1)
      return AOM_CODEC_INVALID_PARAM;
    cpi->ppi->rtc_ref.refresh[i] = data->refresh[i];
  }
  cpi->svc.use_flexible_mode = 1;
  cpi->svc.ksvc_fixed_mode = 0;
  return AOM_CODEC_OK;
}